

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_video.cpp
# Opt level: O2

int V_GetColorFromString(DWORD *palette,char *cstr)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char cVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  char val [3];
  int c [3];
  char *p;
  
  val[2] = '\0';
  cVar5 = *cstr;
  sVar4 = strlen(cstr);
  if (cVar5 == '#') {
    if (sVar4 == 7) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        val[0] = cstr[lVar6 * 2 + 1];
        val[1] = cstr[lVar6 * 2 + 2];
        iVar2 = ParseHex(val);
        c[lVar6] = iVar2;
      }
    }
    else if (sVar4 == 4) {
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        val[0] = cstr[lVar6 + 1];
        val[1] = val[0];
        iVar2 = ParseHex(val);
        c[lVar6] = iVar2;
      }
    }
    else {
      c[0] = 0;
      c[1] = 0;
      c[2] = 0;
    }
  }
  else {
    if (sVar4 == 6) {
      lVar6 = strtol(cstr,&p,0x10);
      if (*p == '\0') {
        c._0_8_ = CONCAT44((int)((ulong)lVar6 >> 8),(int)((ulong)lVar6 >> 0x10)) & 0xff000000ff;
        c[2] = (uint)lVar6 & 0xff;
        goto LAB_005136c9;
      }
    }
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      pcVar8 = cstr + -1;
      do {
        cstr = cstr + 1;
        cVar5 = pcVar8[1];
        pcVar8 = pcVar8 + 1;
        if (' ' < cVar5) break;
      } while (cVar5 != '\0');
      uVar7 = 0;
      while (' ' < cVar5) {
        if (uVar7 < 2) {
          val[uVar7] = cVar5;
        }
        uVar7 = uVar7 + 1;
        cVar5 = *cstr;
        cstr = cstr + 1;
      }
      if ((int)uVar7 == 1) {
        val[1] = val[0];
LAB_00513654:
        iVar2 = ParseHex(val);
      }
      else {
        if ((int)uVar7 != 0) goto LAB_00513654;
        iVar2 = 0;
      }
      cstr = pcVar8 + uVar7;
      c[lVar6] = iVar2;
    }
  }
LAB_005136c9:
  if (palette == (DWORD *)0x0) {
    uVar3 = c[1] << 8 | c[0] << 0x10 | c[2];
  }
  else {
    bVar1 = FColorMatcher::Pick(&ColorMatcher,c[0],c[1],c[2]);
    uVar3 = (uint)bVar1;
  }
  return uVar3;
}

Assistant:

int V_GetColorFromString (const DWORD *palette, const char *cstr)
{
	int c[3], i, p;
	char val[3];

	val[2] = '\0';

	// Check for HTML-style #RRGGBB or #RGB color string
	if (cstr[0] == '#')
	{
		size_t len = strlen (cstr);

		if (len == 7)
		{
			// Extract each eight-bit component into c[].
			for (i = 0; i < 3; ++i)
			{
				val[0] = cstr[1 + i*2];
				val[1] = cstr[2 + i*2];
				c[i] = ParseHex (val);
			}
		}
		else if (len == 4)
		{
			// Extract each four-bit component into c[], expanding to eight bits.
			for (i = 0; i < 3; ++i)
			{
				val[1] = val[0] = cstr[1 + i];
				c[i] = ParseHex (val);
			}
		}
		else
		{
			// Bad HTML-style; pretend it's black.
			c[2] = c[1] = c[0] = 0;
		}
	}
	else
	{
		if (strlen(cstr) == 6)
		{
			char *p;
			int color = strtol(cstr, &p, 16);
			if (*p == 0)
			{
				// RRGGBB string
				c[0] = (color & 0xff0000) >> 16;
				c[1] = (color & 0xff00) >> 8;
				c[2] = (color & 0xff);
			}
			else goto normal;
		}
		else
		{
normal:
			// Treat it as a space-delimited hexadecimal string
			for (i = 0; i < 3; ++i)
			{
				// Skip leading whitespace
				while (*cstr <= ' ' && *cstr != '\0')
				{
					cstr++;
				}
				// Extract a component and convert it to eight-bit
				for (p = 0; *cstr > ' '; ++p, ++cstr)
				{
					if (p < 2)
					{
						val[p] = *cstr;
					}
				}
				if (p == 0)
				{
					c[i] = 0;
				}
				else
				{
					if (p == 1)
					{
						val[1] = val[0];
					}
					c[i] = ParseHex (val);
				}
			}
		}
	}
	if (palette)
		return ColorMatcher.Pick (c[0], c[1], c[2]);
	else
		return MAKERGB(c[0], c[1], c[2]);
}